

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall mpt::unique_array<double>::set(unique_array<double> *this,long pos,double *v)

{
  bool bVar1;
  long lVar2;
  iterator pdVar3;
  double *t;
  double *v_local;
  long pos_local;
  unique_array<double> *this_local;
  
  if (pos < 0) {
    lVar2 = length(this);
    v_local = (double *)(lVar2 + pos);
    if ((long)v_local < 0) {
      return false;
    }
  }
  else {
    lVar2 = length(this);
    v_local = (double *)pos;
    if (lVar2 <= pos) {
      return false;
    }
  }
  bVar1 = detach(this);
  if (bVar1) {
    pdVar3 = begin(this);
    pdVar3[(long)v_local] = *v;
  }
  return bVar1;
}

Assistant:

bool set(long pos, T const &v)
	{
		if (pos < 0) {
			if ((pos += length()) < 0) {
				return false;
			}
		}
		else if (pos >= length()) {
			return false;
		}
		if (!detach()) {
			return false;
		}
		T *t = begin();
		t[pos] = v;
		return true;
	}